

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert_at<std::pair<int,int>const&,int>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          *this,size_type pos,pair<int,_int> *args,int *args_1)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  length_error *this_00;
  
  lVar3 = *(long *)(this + 0x50);
  if (*(long *)(this + 0x58) - lVar3 == -1) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  lVar4 = *(long *)(this + 0x78);
  if (lVar3 != 0) {
    iVar2 = *(int *)(this + 0x38);
    iVar1 = *(int *)(lVar4 + pos * 0xc);
    *(int *)(this + 0x38) = iVar2 + 1;
    if (*(int *)(this + 0x3c) == iVar1) {
      *(int *)(this + 0x38) = iVar2 + 2;
      *(long *)(this + 0x50) = lVar3 + -1;
      goto LAB_008a6bd3;
    }
  }
  *(long *)(this + 0x58) = *(long *)(this + 0x58) + 1;
LAB_008a6bd3:
  lVar5 = pos * 0xc;
  *(pair<int,_int> *)(lVar4 + lVar5) = *args;
  *(int *)(lVar4 + 8 + lVar5) = *args_1;
  lVar3 = *(long *)(this + 0x60);
  lVar4 = *(long *)(this + 0x78);
  __return_storage_ptr__->ht =
       (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)this;
  __return_storage_ptr__->pos = (pointer)(lVar5 + lVar4);
  __return_storage_ptr__->end = (pointer)(lVar4 + lVar3 * 0xc);
  return __return_storage_ptr__;
}

Assistant:

size_type size() const { return num_elements - num_deleted; }